

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::Function::~Function(Function *this)

{
  bool bVar1;
  reference ppBVar2;
  Block *in_RDI;
  Block *block;
  iterator __end2;
  iterator __begin2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_stack_ffffffffffffffc8;
  Block *pBVar3;
  _Self local_20;
  _Self local_18;
  pointer *local_10;
  
  local_10 = &(in_RDI->llvmInstructions_).
              super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppBVar2 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                        ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x21ae29);
    pBVar3 = *ppBVar2;
    if (pBVar3 != (Block *)0x0) {
      Block::~Block(in_RDI);
      operator_delete(pBVar3,0x118);
    }
    std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)in_RDI);
  }
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::~set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          *)0x21ae73);
  return;
}

Assistant:

Function::~Function() {
    for (auto *block : blocks) {
        delete block;
    }
}